

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

optional<pbrt::LightLeSample> * __thiscall
pbrt::ImageInfiniteLight::SampleLe
          (optional<pbrt::LightLeSample> *__return_storage_ptr__,ImageInfiniteLight *this,Point2f u1
          ,Point2f u2,SampledWavelengths *lambda,Float time)

{
  Float FVar1;
  Float FVar2;
  Float FVar3;
  Float FVar4;
  float fVar5;
  Float FVar6;
  undefined4 uVar7;
  undefined4 uVar9;
  undefined8 uVar8;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined4 uVar26;
  undefined1 in_register_00001248 [56];
  undefined1 auVar27 [64];
  undefined1 auVar30 [60];
  undefined1 auVar28 [64];
  undefined1 auVar31 [56];
  undefined1 auVar29 [64];
  undefined1 auVar32 [16];
  float fVar33;
  undefined1 auVar34 [16];
  float fVar35;
  undefined1 auVar36 [16];
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  Vector3f VVar44;
  SampledSpectrum SVar45;
  Float mapPDF;
  Float local_dc;
  undefined1 local_d8 [8];
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [8];
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [16];
  Float local_a8 [4];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  Tuple2<pbrt::Point2,_float> local_20;
  undefined1 extraout_var [56];
  undefined1 auVar25 [56];
  
  auVar27._8_56_ = in_register_00001248;
  auVar27._0_8_ = u2.super_Tuple2<pbrt::Point2,_float>;
  auVar21._8_56_ = in_register_00001208;
  auVar21._0_8_ = u1.super_Tuple2<pbrt::Point2,_float>;
  _local_d8 = auVar27._0_16_;
  local_20 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar21._0_16_);
  auVar22._0_8_ = PiecewiseConstant2D::Sample(&this->distribution,(Point2f *)&local_20,&local_dc);
  auVar30 = auVar27._4_60_;
  auVar22._8_56_ = extraout_var;
  local_38 = auVar22._0_16_;
  auVar25 = extraout_var;
  VVar44 = EqualAreaSquareToSphere(auVar22._0_8_);
  auVar28._0_4_ = VVar44.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar28._4_60_ = auVar30;
  auVar23._0_8_ = VVar44.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar23._8_56_ = auVar25;
  local_88 = auVar23._0_16_;
  local_a8 = (this->super_LightBase).renderFromLight.m.m[0];
  _local_c8 = *(undefined1 (*) [16])((this->super_LightBase).renderFromLight.m.m[0] + 1);
  local_98 = *(undefined1 (*) [16])((this->super_LightBase).renderFromLight.m.m[0] + 2);
  FVar1 = (this->super_LightBase).renderFromLight.m.m[1][0];
  FVar2 = (this->super_LightBase).renderFromLight.m.m[1][1];
  FVar3 = (this->super_LightBase).renderFromLight.m.m[1][2];
  FVar4 = (this->super_LightBase).renderFromLight.m.m[2][0];
  fVar5 = (this->super_LightBase).renderFromLight.m.m[2][1];
  FVar6 = (this->super_LightBase).renderFromLight.m.m[2][2];
  auVar13._0_4_ = (float)local_d8._0_4_ + (float)local_d8._0_4_;
  auVar13._4_4_ = (float)local_d8._4_4_ + (float)local_d8._4_4_;
  auVar13._8_4_ = fStack_d0 + fStack_d0;
  auVar13._12_4_ = fStack_cc + fStack_cc;
  auVar10._8_4_ = 0xbf800000;
  auVar10._0_8_ = 0xbf800000bf800000;
  auVar10._12_4_ = 0xbf800000;
  auVar13 = vaddps_avx512vl(auVar13,auVar10);
  auVar10 = vmovshdup_avx(auVar13);
  fVar17 = auVar13._0_4_;
  fVar18 = auVar10._0_4_;
  _local_d8 = auVar28._0_16_;
  if (fVar17 == 0.0) {
    auVar19 = ZEXT416(0) << 0x20;
    if ((fVar18 == 0.0) &&
       (auVar14 = ZEXT416((uint)FVar1), auVar16 = ZEXT416((uint)FVar3),
       auVar20 = ZEXT416((uint)FVar2), !NAN(fVar18))) goto LAB_0035ad01;
  }
  auVar19._8_4_ = 0x7fffffff;
  auVar19._0_8_ = 0x7fffffff7fffffff;
  auVar19._12_4_ = 0x7fffffff;
  auVar14 = vandps_avx512vl(auVar13,auVar19);
  auVar19 = vshufps_avx(auVar14,auVar14,0xf5);
  bVar12 = auVar19._0_4_ < auVar14._0_4_;
  auVar14._0_4_ = fVar17 / fVar18;
  auVar14._4_12_ = auVar13._4_12_;
  auVar13 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf490fdb),0),auVar14,ZEXT416(0x3fc90fdb));
  local_78._4_12_ = auVar13._4_12_;
  local_78._0_4_ =
       (uint)bVar12 * (int)((fVar18 / fVar17) * 0.7853982) + (uint)!bVar12 * auVar13._0_4_;
  local_68._4_12_ = auVar10._4_12_;
  local_68._0_4_ = (uint)bVar12 * (int)fVar17 + (uint)!bVar12 * (int)fVar18;
  local_b8 = ZEXT416((uint)FVar3);
  local_48 = ZEXT416((uint)FVar1);
  local_58 = ZEXT416((uint)FVar2);
  fVar17 = cosf((float)local_78._0_4_);
  fVar18 = sinf((float)local_78._0_4_);
  auVar19 = vinsertps_avx(ZEXT416((uint)((float)local_68._0_4_ * fVar17)),
                          ZEXT416((uint)((float)local_68._0_4_ * fVar18)),0x10);
  auVar14 = local_48;
  auVar16 = local_b8;
  auVar20 = local_58;
LAB_0035ad01:
  auVar13 = vmovshdup_avx(local_88);
  auVar10 = vfmadd213ss_fma(ZEXT416((uint)FVar4),local_88,ZEXT416((uint)(auVar13._0_4_ * fVar5)));
  auVar32._8_4_ = 0x3f800000;
  auVar32._0_8_ = 0x3f8000003f800000;
  auVar32._12_4_ = 0x3f800000;
  auVar11 = vfmadd213ss_fma(_local_d8,ZEXT416((uint)FVar6),auVar10);
  auVar34._8_4_ = 0x80000000;
  auVar34._0_8_ = 0x8000000080000000;
  auVar34._12_4_ = 0x80000000;
  auVar15 = vpternlogd_avx512vl(auVar32,auVar11,auVar34,0xf8);
  fVar33 = auVar11._0_4_;
  fVar35 = auVar15._0_4_;
  auVar36._0_4_ = -1.0 / (fVar33 + fVar35);
  fVar5 = this->sceneRadius;
  auVar10 = vinsertps_avx(_local_c8,auVar20,0x10);
  auVar42._0_4_ = auVar13._0_4_ * auVar10._0_4_;
  auVar42._4_4_ = auVar13._4_4_ * auVar10._4_4_;
  auVar42._8_4_ = auVar13._8_4_ * auVar10._8_4_;
  auVar42._12_4_ = auVar13._12_4_ * auVar10._12_4_;
  auVar10 = vinsertps_avx512f((undefined1  [16])local_a8,auVar14,0x10);
  uVar26 = local_88._0_4_;
  auVar41._4_4_ = uVar26;
  auVar41._0_4_ = uVar26;
  auVar41._8_4_ = uVar26;
  auVar41._12_4_ = uVar26;
  auVar13 = vfmadd213ps_fma(auVar41,auVar10,auVar42);
  auVar10 = vinsertps_avx512f(local_98,auVar16,0x10);
  uVar26 = local_d8._0_4_;
  auVar16._4_4_ = uVar26;
  auVar16._0_4_ = uVar26;
  auVar16._8_4_ = uVar26;
  auVar16._12_4_ = uVar26;
  auVar13 = vfmadd213ps_fma(auVar16,auVar10,auVar13);
  fVar37 = auVar13._0_4_;
  auVar10 = vmovshdup_avx(auVar13);
  fVar17 = fVar37 * auVar10._0_4_ * auVar36._0_4_;
  auVar43._0_4_ = fVar37 * fVar37 * fVar35;
  fVar38 = auVar13._4_4_;
  auVar43._4_4_ = fVar38 * 0.0;
  fVar39 = auVar13._8_4_;
  auVar43._8_4_ = fVar39 * 0.0;
  fVar40 = auVar13._12_4_;
  auVar43._12_4_ = fVar40 * 0.0;
  auVar36._4_4_ = auVar36._0_4_;
  auVar36._8_4_ = auVar36._0_4_;
  auVar36._12_4_ = auVar36._0_4_;
  auVar10 = vinsertps_avx(auVar32,auVar15,0x10);
  auVar14 = vfmadd231ps_fma(auVar10,auVar43,auVar36);
  local_88._0_8_ = auVar13._0_8_ ^ 0x8000000080000000;
  local_88._8_4_ = -fVar39;
  local_88._12_4_ = -fVar40;
  fVar18 = auVar19._0_4_;
  auVar16 = vpermi2ps_avx512vl(_DAT_02875000,ZEXT416((uint)(fVar35 * fVar17)),ZEXT416((uint)fVar17))
  ;
  auVar13 = vshufps_avx(auVar19,auVar19,0xe1);
  auVar20._0_4_ = fVar37 * fVar18;
  auVar20._4_4_ = fVar38 * auVar19._4_4_;
  auVar20._8_4_ = fVar39 * auVar19._8_4_;
  auVar20._12_4_ = fVar40 * auVar19._12_4_;
  auVar10 = vmovshdup_avx(auVar20);
  uVar7 = (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.x;
  uVar9 = (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.y;
  auVar15._0_4_ =
       (float)uVar7 +
       fVar5 * (fVar37 * 0.0 + auVar16._0_4_ * auVar13._0_4_ + auVar14._0_4_ * fVar18);
  auVar15._4_4_ =
       (float)uVar9 +
       fVar5 * (fVar38 * 0.0 + auVar16._4_4_ * auVar13._4_4_ + auVar14._4_4_ * auVar19._4_4_);
  auVar15._8_4_ =
       fVar5 * (fVar39 * 0.0 + auVar16._8_4_ * auVar13._8_4_ + auVar14._8_4_ * auVar19._8_4_) + 0.0;
  auVar15._12_4_ =
       fVar5 * (fVar40 * 0.0 + auVar16._12_4_ * auVar13._12_4_ + auVar14._12_4_ * auVar19._12_4_) +
       0.0;
  auVar31 = ZEXT856(auVar15._8_8_);
  local_b8._0_4_ =
       fVar5 * fVar33 +
       fVar5 * (fVar33 * 0.0 + (fVar37 * -fVar35 * fVar18 - auVar10._0_4_)) +
       (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.z;
  local_c8._4_4_ = fVar38 * fVar5 + auVar15._4_4_;
  local_c8._0_4_ = fVar37 * fVar5 + auVar15._0_4_;
  fStack_c0 = fVar39 * fVar5 + auVar15._8_4_;
  fStack_bc = fVar40 * fVar5 + auVar15._12_4_;
  local_98 = ZEXT416((uint)(fVar5 * fVar5 * 3.1415927));
  local_a8 = (Float  [4])vinsertps_avx(auVar32,ZEXT416((uint)local_dc),0x10);
  auVar25 = ZEXT856((ulong)local_38._8_8_);
  _local_d8 = auVar11 ^ auVar34;
  SVar45 = Le(this,(Point2f)local_38._0_8_,lambda);
  auVar29._0_8_ = SVar45.values.values._8_8_;
  auVar29._8_56_ = auVar31;
  auVar24._0_8_ = SVar45.values.values._0_8_;
  auVar24._8_56_ = auVar25;
  __return_storage_ptr__->set = true;
  auVar10 = vmovlhps_avx(auVar24._0_16_,auVar29._0_16_);
  *(undefined1 (*) [16])&__return_storage_ptr__->optionalValue = auVar10;
  uVar8 = vmovlps_avx(_local_c8);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uVar8;
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = local_b8._0_4_;
  uVar8 = vmovlps_avx(local_88);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = uVar8;
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x24) = local_d8._0_4_;
  *(Float *)((long)&__return_storage_ptr__->optionalValue + 0x28) = time;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
  (__return_storage_ptr__->optionalValue).__data[0x88] = '\0';
  auVar10 = vblendps_avx(local_98,_DAT_02876070,0xe);
  auVar10 = vdivps_avx((undefined1  [16])local_a8,auVar10);
  uVar8 = vmovlps_avx(auVar10);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) = uVar8;
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<LightLeSample> ImageInfiniteLight::SampleLe(Point2f u1, Point2f u2,
                                                           SampledWavelengths &lambda,
                                                           Float time) const {
    // Sample infinite light image and compute ray direction _w_
    Float mapPDF;
    Point2f uv = distribution.Sample(u1, &mapPDF);
    Vector3f wl = EqualAreaSquareToSphere(uv);
    Vector3f w = -renderFromLight(wl);

    // Compute infinite light sample ray
    Frame wFrame = Frame::FromZ(-w);
    Point2f cd = SampleUniformDiskConcentric(u2);
    Point3f pDisk = sceneCenter + sceneRadius * wFrame.FromLocal(Vector3f(cd.x, cd.y, 0));
    Ray ray(pDisk + sceneRadius * -w, w, time);

    // Compute _ImageInfiniteLight_ ray PDFs
    Float pdfDir = mapPDF / (4 * Pi);
    Float pdfPos = 1 / (Pi * Sqr(sceneRadius));

    return LightLeSample(Le(uv, lambda), ray, pdfPos, pdfDir);
}